

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  long lVar1;
  wchar_t wVar2;
  ulong *puVar3;
  int in_EDX;
  int iVar4;
  int *in_RSI;
  long in_RDI;
  uint rbits;
  wchar_t same;
  wchar_t ret;
  wchar_t j;
  wchar_t i;
  wchar_t c;
  lzx_br *br;
  lzx_dec *ds;
  huffman *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  wchar_t local_40;
  int local_3c;
  int local_38;
  int local_1c;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  puVar3 = (ulong *)(lVar1 + 0x68);
  local_38 = *(int *)(lVar1 + 600);
  if (local_38 == 0) {
    memset(in_RSI + 1,0,0x44);
  }
  local_40 = L'\0';
  local_1c = in_EDX;
  if (in_EDX < 0) {
    local_1c = *in_RSI;
  }
  while (local_38 < local_1c) {
    *(int *)(lVar1 + 600) = local_38;
    if (((*(int *)(lVar1 + 0x70) < *(int *)(lVar1 + 0x230)) &&
        (wVar2 = lzx_br_fillup((lzx_stream *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (lzx_br *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
        wVar2 == L'\0')) && (*(int *)(lVar1 + 0x70) < *(int *)(lVar1 + 0x230))) goto LAB_001477aa;
    in_stack_ffffffffffffffb8 =
         (uint)(*puVar3 >>
               ((char)*(undefined4 *)(lVar1 + 0x70) - (char)*(int *)(lVar1 + 0x230) & 0x3fU)) &
         cache_masks[*(int *)(lVar1 + 0x230)];
    in_stack_ffffffffffffffb4 = lzx_decode_huffman(in_stack_ffffffffffffffa8,0);
    if (in_stack_ffffffffffffffb4 == L'\x11') {
      if (((*(int *)(lVar1 + 0x70) < (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x11) + 4)) &&
          (wVar2 = lzx_br_fillup((lzx_stream *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (lzx_br *)CONCAT44(0x11,in_stack_ffffffffffffffb0)), wVar2 == L'\0'
          )) && (*(int *)(lVar1 + 0x70) < (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x11) + 4)))
      goto LAB_001477aa;
      *(uint *)(lVar1 + 0x70) =
           *(int *)(lVar1 + 0x70) - (uint)*(byte *)(*(long *)(lVar1 + 0x228) + 0x11);
      in_stack_ffffffffffffffbc =
           ((uint)(*puVar3 >> ((char)*(undefined4 *)(lVar1 + 0x70) - 4U & 0x3f)) & 0xf) + 4;
      if (local_1c < local_38 + in_stack_ffffffffffffffbc) {
        return L'\xffffffff';
      }
      *(int *)(lVar1 + 0x70) = *(int *)(lVar1 + 0x70) + -4;
      for (local_3c = 0; local_3c < in_stack_ffffffffffffffbc; local_3c = local_3c + 1) {
        *(undefined1 *)(*(long *)(in_RSI + 0x12) + (long)local_38) = 0;
        local_38 = local_38 + 1;
      }
    }
    else if (in_stack_ffffffffffffffb4 == L'\x12') {
      if (((*(int *)(lVar1 + 0x70) < (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x12) + 5)) &&
          (wVar2 = lzx_br_fillup((lzx_stream *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (lzx_br *)CONCAT44(0x12,in_stack_ffffffffffffffb0)), wVar2 == L'\0'
          )) && (*(int *)(lVar1 + 0x70) < (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x12) + 5)))
      goto LAB_001477aa;
      *(uint *)(lVar1 + 0x70) =
           *(int *)(lVar1 + 0x70) - (uint)*(byte *)(*(long *)(lVar1 + 0x228) + 0x12);
      in_stack_ffffffffffffffbc =
           ((uint)(*puVar3 >> ((char)*(undefined4 *)(lVar1 + 0x70) - 5U & 0x3f)) & 0x1f) + 0x14;
      if (local_1c < local_38 + in_stack_ffffffffffffffbc) {
        return L'\xffffffff';
      }
      *(int *)(lVar1 + 0x70) = *(int *)(lVar1 + 0x70) + -5;
      memset((void *)(*(long *)(in_RSI + 0x12) + (long)local_38),0,(long)in_stack_ffffffffffffffbc);
      local_38 = in_stack_ffffffffffffffbc + local_38;
    }
    else if (in_stack_ffffffffffffffb4 == L'\x13') {
      if (((*(int *)(lVar1 + 0x70) <
            (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x13) + 1 + *(int *)(lVar1 + 0x230))) &&
          (wVar2 = lzx_br_fillup((lzx_stream *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (lzx_br *)CONCAT44(0x13,in_stack_ffffffffffffffb0)), wVar2 == L'\0'
          )) && (*(int *)(lVar1 + 0x70) <
                 (int)(*(byte *)(*(long *)(lVar1 + 0x228) + 0x13) + 1 + *(int *)(lVar1 + 0x230))))
      goto LAB_001477aa;
      *(uint *)(lVar1 + 0x70) =
           *(int *)(lVar1 + 0x70) - (uint)*(byte *)(*(long *)(lVar1 + 0x228) + 0x13);
      in_stack_ffffffffffffffbc =
           ((uint)(*puVar3 >> ((char)*(undefined4 *)(lVar1 + 0x70) - 1U & 0x3f)) & 1) + 4;
      if (local_1c < local_38 + in_stack_ffffffffffffffbc) {
        return L'\xffffffff';
      }
      *(int *)(lVar1 + 0x70) = *(int *)(lVar1 + 0x70) + -1;
      in_stack_ffffffffffffffb8 =
           (uint)(*puVar3 >>
                 ((char)*(undefined4 *)(lVar1 + 0x70) - (char)*(undefined4 *)(lVar1 + 0x230) & 0x3fU
                 )) & cache_masks[*(int *)(lVar1 + 0x230)];
      wVar2 = lzx_decode_huffman(in_stack_ffffffffffffffa8,0);
      *(uint *)(lVar1 + 0x70) =
           *(int *)(lVar1 + 0x70) - (uint)*(byte *)(*(long *)(lVar1 + 0x228) + (long)wVar2);
      iVar4 = (((uint)*(byte *)(*(long *)(in_RSI + 0x12) + (long)local_38) - wVar2) + 0x11) % 0x11;
      if (iVar4 < 0) {
        return L'\xffffffff';
      }
      for (local_3c = 0; local_3c < in_stack_ffffffffffffffbc; local_3c = local_3c + 1) {
        *(char *)(*(long *)(in_RSI + 0x12) + (long)local_38) = (char)iVar4;
        local_38 = local_38 + 1;
      }
      in_RSI[(long)iVar4 + 1] = in_stack_ffffffffffffffbc + in_RSI[(long)iVar4 + 1];
    }
    else {
      *(uint *)(lVar1 + 0x70) =
           *(int *)(lVar1 + 0x70) -
           (uint)*(byte *)(*(long *)(lVar1 + 0x228) + (long)in_stack_ffffffffffffffb4);
      iVar4 = (((uint)*(byte *)(*(long *)(in_RSI + 0x12) + (long)local_38) -
               in_stack_ffffffffffffffb4) + 0x11) % 0x11;
      if (iVar4 < 0) {
        return L'\xffffffff';
      }
      in_RSI[(long)iVar4 + 1] = in_RSI[(long)iVar4 + 1] + 1;
      *(char *)(*(long *)(in_RSI + 0x12) + (long)local_38) = (char)iVar4;
      local_38 = local_38 + 1;
    }
  }
  local_40 = L'\x01';
LAB_001477aa:
  *(int *)(lVar1 + 600) = local_38;
  return local_40;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}